

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall
basisu::vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::clear
          (vector<basisu::basisu_frontend::endpoint_cluster_etc_params> *this)

{
  if (this->m_p != (endpoint_cluster_etc_params *)0x0) {
    destruct_array<basisu::basisu_frontend::endpoint_cluster_etc_params>
              (this->m_p,(ulong)this->m_size);
    free(this->m_p);
    this->m_p = (endpoint_cluster_etc_params *)0x0;
    this->m_size = 0;
    this->m_capacity = 0;
  }
  return;
}

Assistant:

inline void clear()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
            m_p = NULL;
            m_size = 0;
            m_capacity = 0;
         }
      }